

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O1

void __thiscall
cbtGImpactMeshShapePart::cbtGImpactMeshShapePart
          (cbtGImpactMeshShapePart *this,cbtStridingMeshInterface *meshInterface,int part)

{
  undefined1 auVar1 [16];
  
  cbtGImpactShapeInterface::cbtGImpactShapeInterface(&this->super_cbtGImpactShapeInterface);
  (this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtGImpactMeshShapePart_00b74438;
  (this->m_primitive_manager).super_cbtPrimitiveManagerBase._vptr_cbtPrimitiveManagerBase =
       (_func_int **)&PTR__cbtPrimitiveManagerBase_00b74828;
  (this->m_primitive_manager).m_margin = 0.01;
  (this->m_primitive_manager).m_scale.m_floats[0] = 1.0;
  (this->m_primitive_manager).m_scale.m_floats[1] = 1.0;
  (this->m_primitive_manager).m_scale.m_floats[2] = 1.0;
  (this->m_primitive_manager).m_scale.m_floats[3] = 0.0;
  (this->m_primitive_manager).stride = 0;
  auVar1 = ZEXT816(0) << 0x20;
  (this->m_primitive_manager).m_lock_count = auVar1._0_4_;
  (this->m_primitive_manager).vertexbase = (uchar *)auVar1._4_8_;
  (this->m_primitive_manager).numverts = auVar1._12_4_;
  (this->m_primitive_manager).indexbase = (uchar *)auVar1._0_8_;
  (this->m_primitive_manager).indexstride = auVar1._8_4_;
  (this->m_primitive_manager).numfaces = auVar1._12_4_;
  (this->m_primitive_manager).m_meshInterface = meshInterface;
  (this->m_primitive_manager).m_part = part;
  (this->super_cbtGImpactShapeInterface).m_box_set.m_primitive_manager =
       &(this->m_primitive_manager).super_cbtPrimitiveManagerBase;
  TrimeshPrimitiveManager::lock(&this->m_primitive_manager);
  return;
}

Assistant:

cbtGImpactMeshShapePart::cbtGImpactMeshShapePart(cbtStridingMeshInterface* meshInterface, int part)
{
	// moved from .h to .cpp because of conditional compilation
	// (The setting of BT_THREADSAFE may differ between various cpp files, so it is best to
	// avoid using it in h files)
	m_primitive_manager.m_meshInterface = meshInterface;
	m_primitive_manager.m_part = part;
	m_box_set.setPrimitiveManager(&m_primitive_manager);
#if BT_THREADSAFE
	// If threadsafe is requested, this object uses a different lock/unlock
	//  model with the cbtStridingMeshInterface -- lock once when the object is constructed
	//  and unlock once in the destructor.
	// The other way of locking and unlocking for each collision check in the narrowphase
	// is not threadsafe.  Note these are not thread-locks, they are calls to the meshInterface's
	// getLockedReadOnlyVertexIndexBase virtual function, which by default just returns a couple of
	// pointers.  In theory a client could override the lock function to do all sorts of
	// things like reading data from GPU memory, or decompressing data on the fly, but such things
	// do not seem all that likely or useful, given the performance cost.
	m_primitive_manager.lock();
#endif
}